

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

void ctype_preptype(CTRepr *ctr,CType *ct,CTInfo qual,char *t)

{
  size_t sVar1;
  CTRepr *in_RCX;
  long in_RSI;
  CTRepr *in_RDI;
  GCstr *str;
  
  if (*(int *)(in_RSI + 0xc) == 0) {
    if (in_RDI->needsp != 0) {
      ctype_prepc(in_RDI,0x20);
    }
    ctype_prepnum(in_RDI,(uint32_t)(in_RSI - (long)in_RDI->cts->tab >> 4));
    in_RDI->needsp = 1;
  }
  else {
    ctype_prepstr(in_RDI,(char *)((ulong)*(uint *)(in_RSI + 0xc) + 0x10),
                  *(MSize *)((ulong)*(uint *)(in_RSI + 0xc) + 0xc));
  }
  sVar1 = strlen((char *)in_RCX);
  ctype_prepstr(in_RDI,(char *)in_RCX,(MSize)sVar1);
  ctype_prepqual(in_RCX,(CTInfo)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

static void ctype_preptype(CTRepr *ctr, CType *ct, CTInfo qual, const char *t)
{
  if (gcref(ct->name)) {
    GCstr *str = gco2str(gcref(ct->name));
    ctype_prepstr(ctr, strdata(str), str->len);
  } else {
    if (ctr->needsp) ctype_prepc(ctr, ' ');
    ctype_prepnum(ctr, ctype_typeid(ctr->cts, ct));
    ctr->needsp = 1;
  }
  ctype_prepstr(ctr, t, (MSize)strlen(t));
  ctype_prepqual(ctr, qual);
}